

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5c5a51::ECTest_ZeroPadding_Test::TestBody(ECTest_ZeroPadding_Test *this)

{
  _Head_base<0UL,_ec_key_st_*,_false> _Var1;
  int iVar2;
  size_t sVar3;
  EC_KEY *pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar5;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  bool bVar7;
  UniquePtr<EC_KEY> key;
  uint8_t large_buf [33];
  uint8_t buf [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  UniquePtr<uint8_t> free_buf_alloc;
  size_t len;
  uint8_t *buf_alloc;
  AssertHelper local_110;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_f8 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dStack_f0;
  undefined7 uStack_ef;
  undefined1 local_e8 [24];
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Head_base<0UL,_ec_key_st_*,_false> local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  undefined1 local_78 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  AssertHelper local_38;
  __uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter> local_30;
  size_t local_28;
  _Head_base<0UL,_unsigned_char_*,_false> local_20;
  
  DecodeECPrivateKey((anon_unknown_dwarf_5c5a51 *)&local_b0,"0w\x02\x01\x01\x04 ",0x79);
  local_f8[0] = (internal)(local_b0._M_head_impl != (EC_KEY *)0x0);
  dStack_f0 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )0x0;
  uStack_ef = 0;
  if (local_b0._M_head_impl == (EC_KEY *)0x0) {
    testing::Message::Message((Message *)local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_f8,(AssertionResult *)0x5e57b2,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd0,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a8._1_7_,local_a8[0]) != local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98[0]._M_allocated_capacity + 1)
      ;
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(uStack_ef,dStack_f0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(&dStack_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(uStack_ef,dStack_f0));
    }
    goto LAB_002cd7f4;
  }
  local_78._32_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aStack_50._M_allocated_capacity = 0;
  aStack_50._8_8_ = 0;
  local_f8[0] = (internal)
                EncodeECPrivateKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   (local_78 + 0x20),local_b0._M_head_impl);
  dStack_f0 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )0x0;
  uStack_ef = 0;
  if (!(bool)local_f8[0]) {
    testing::Message::Message((Message *)local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_f8,
               (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd2,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a8._1_7_,local_a8[0]) != local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98[0]._M_allocated_capacity + 1)
      ;
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._0_8_ !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(uStack_ef,dStack_f0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(&dStack_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(uStack_ef,dStack_f0));
    }
  }
  local_f8[0] = (internal)0xe0;
  local_f8._1_7_ = 0x549b;
  dStack_f0 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )0x79;
  uStack_ef = 0;
  local_78._8_8_ = aStack_50._M_allocated_capacity - local_78._32_8_;
  local_78._0_8_ = local_78._32_8_;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_a8,"Bytes(kECKeyWithZeros)","Bytes(out.data(), out.size())",
             (Bytes *)local_f8,(Bytes *)local_78);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if ((long *)CONCAT71(local_f8._1_7_,local_f8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_f8._1_7_,local_f8[0]) + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_78._0_4_ = 0x20;
  sVar3 = EC_KEY_priv2oct(local_b0._M_head_impl,(uint8_t *)0x0,0);
  local_f8[0] = SUB81(sVar3,0);
  local_f8._1_7_ = (undefined7)(sVar3 >> 8);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"32u","EC_KEY_priv2oct(key.get(), nullptr, 0)",(uint *)local_78,
             (unsigned_long *)local_f8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd6,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if ((long *)CONCAT71(local_f8._1_7_,local_f8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_f8._1_7_,local_f8[0]) + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_d0._0_4_ = 0x20;
  sVar3 = EC_KEY_priv2oct(local_b0._M_head_impl,local_78,0x20);
  local_f8[0] = SUB81(sVar3,0);
  local_f8._1_7_ = (undefined7)(sVar3 >> 8);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"32u","EC_KEY_priv2oct(key.get(), buf, sizeof(buf))",
             (uint *)local_d0,(unsigned_long *)local_f8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((long *)CONCAT71(local_f8._1_7_,local_f8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_f8._1_7_,local_f8[0]) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0;
      goto LAB_002cd7d2;
    }
  }
  else {
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    local_f8[0] = SUB81(local_78,0);
    local_f8._1_7_ = (undefined7)((ulong)local_78 >> 8);
    dStack_f0 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 )0x20;
    uStack_ef = 0;
    local_d0 = (undefined1  [8])&(anonymous_namespace)::kECKeyWithZerosRawPrivate;
    local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000020;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_a8,"Bytes(buf)","Bytes(kECKeyWithZerosRawPrivate)",
               (Bytes *)local_f8,(Bytes *)local_d0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_f8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xd9,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
      if ((long *)CONCAT71(local_f8._1_7_,local_f8[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_f8._1_7_,local_f8[0]) + 8))();
      }
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    local_d0 = (undefined1  [8])((ulong)local_d0 & 0xffffffff00000000);
    sVar3 = EC_KEY_priv2oct(local_b0._M_head_impl,(uint8_t *)local_78,0x1f);
    local_f8[0] = SUB81(sVar3,0);
    local_f8._1_7_ = (undefined7)(sVar3 >> 8);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a8,"0u","EC_KEY_priv2oct(key.get(), buf, sizeof(buf) - 1)",
               (uint *)local_d0,(unsigned_long *)local_f8);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_f8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xdc,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
      if ((long *)CONCAT71(local_f8._1_7_,local_f8[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_f8._1_7_,local_f8[0]) + 8))();
      }
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    local_108._0_4_ = 0x20;
    local_d0 = (undefined1  [8])EC_KEY_priv2oct(local_b0._M_head_impl,local_a8,0x21);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_f8,"32u","EC_KEY_priv2oct(key.get(), large_buf, sizeof(large_buf))"
               ,(uint *)local_108,(unsigned_long *)local_d0);
    if (local_f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_d0);
      if ((undefined8 *)CONCAT71(uStack_ef,dStack_f0) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(uStack_ef,dStack_f0);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xe0,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_d0);
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT71(uStack_ef,dStack_f0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(&dStack_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT71(uStack_ef,dStack_f0));
      }
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000020;
      local_108 = (undefined1  [8])&(anonymous_namespace)::kECKeyWithZerosRawPrivate;
      local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000020
      ;
      local_d0 = (undefined1  [8])local_78;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_f8,"Bytes(buf)","Bytes(kECKeyWithZerosRawPrivate)",
                 (Bytes *)local_d0,(Bytes *)local_108);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_d0);
        if ((undefined8 *)CONCAT71(uStack_ef,dStack_f0) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT71(uStack_ef,dStack_f0);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xe1,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
        if (local_d0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_d0 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT71(uStack_ef,dStack_f0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(&dStack_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT71(uStack_ef,dStack_f0));
      }
      local_28 = EC_KEY_priv2buf(local_b0._M_head_impl,&local_20._M_head_impl);
      local_d0 = (undefined1  [8])((ulong)local_d0 & 0xffffffff00000000);
      testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
                ((internal *)local_f8,"len","0u",&local_28,(uint *)local_d0);
      if (local_f8[0] != (internal)0x0) {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT71(uStack_ef,dStack_f0) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(&dStack_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT71(uStack_ef,dStack_f0));
        }
        local_30._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (tuple<unsigned_char_*,_bssl::internal::Deleter>)
             (tuple<unsigned_char_*,_bssl::internal::Deleter>)local_20._M_head_impl;
        local_d0 = (undefined1  [8])local_20._M_head_impl;
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
        local_108 = (undefined1  [8])&(anonymous_namespace)::kECKeyWithZerosRawPrivate;
        local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &DAT_00000020;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_f8,"Bytes(buf_alloc, len)","Bytes(kECKeyWithZerosRawPrivate)",
                   (Bytes *)local_d0,(Bytes *)local_108);
        if (local_f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_d0);
          if ((undefined8 *)CONCAT71(uStack_ef,dStack_f0) == (undefined8 *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)CONCAT71(uStack_ef,dStack_f0);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_108,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0xe8,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
          if (local_d0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_d0 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT71(uStack_ef,dStack_f0) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(&dStack_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT71(uStack_ef,dStack_f0));
        }
        DecodeECPrivateKey((anon_unknown_dwarf_5c5a51 *)local_f8,
                           (anonymous_namespace)::kECKeyMissingZeros,0x5a);
        _Var1._M_head_impl = local_b0._M_head_impl;
        pEVar4 = (EC_KEY *)CONCAT71(local_f8._1_7_,local_f8[0]);
        local_f8[0] = (internal)0x0;
        local_f8._1_7_ = 0;
        bVar7 = local_b0._M_head_impl != (EC_KEY *)0x0;
        local_b0._M_head_impl = pEVar4;
        if (bVar7) {
          EC_KEY_free((EC_KEY *)_Var1._M_head_impl);
        }
        std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)local_f8);
        local_d0[0] = local_b0._M_head_impl != (EC_KEY *)0x0;
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_b0._M_head_impl == (EC_KEY *)0x0) {
          testing::Message::Message((Message *)local_108);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d0,(AssertionResult *)0x5e57b2,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0xec,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
          testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
LAB_002ce08b:
          pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8;
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          if ((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]) != local_e8) {
            operator_delete((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]),
                            CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
          }
          __ptr_00 = local_c8;
          if (local_108 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_108 + 8))();
            __ptr_00 = local_c8;
          }
LAB_002ce0c5:
          if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(pdVar5,__ptr_00);
          }
        }
        else {
          bVar7 = EncodeECPrivateKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     (local_78 + 0x20),local_b0._M_head_impl);
          local_d0[0] = bVar7;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!bVar7) {
            testing::Message::Message((Message *)local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f8,(internal *)local_d0,
                       (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xed,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            if ((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]) != local_e8) {
              operator_delete((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]),
                              CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
            }
            if (local_108 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_108 + 8))();
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
          }
          local_d0 = (undefined1  [8])&(anonymous_namespace)::kECKeyWithZeros;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x79;
          local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (aStack_50._M_allocated_capacity - local_78._32_8_);
          local_108 = (undefined1  [8])local_78._32_8_;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_f8,"Bytes(kECKeyWithZeros)","Bytes(out.data(), out.size())",
                     (Bytes *)local_d0,(Bytes *)local_108);
          if (local_f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_d0);
            if ((undefined8 *)CONCAT71(uStack_ef,dStack_f0) == (undefined8 *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)CONCAT71(uStack_ef,dStack_f0);
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_108,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xee,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_108,(Message *)local_d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
            if (local_d0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_d0 + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(uStack_ef,dStack_f0) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(&dStack_f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(uStack_ef,dStack_f0));
          }
          pEVar4 = (EC_KEY *)EC_KEY_new_by_curve_name(0x19f);
          _Var1._M_head_impl = local_b0._M_head_impl;
          bVar7 = local_b0._M_head_impl != (EC_KEY *)0x0;
          local_b0._M_head_impl = pEVar4;
          if (bVar7) {
            EC_KEY_free((EC_KEY *)_Var1._M_head_impl);
          }
          local_d0[0] = local_b0._M_head_impl != (EC_KEY *)0x0;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_b0._M_head_impl == (EC_KEY *)0x0) {
            testing::Message::Message((Message *)local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f8,(internal *)local_d0,(AssertionResult *)0x5e57b2,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xf2,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
            goto LAB_002ce08b;
          }
          iVar2 = EC_KEY_oct2key(local_b0._M_head_impl,(anonymous_namespace)::kECKeyWithZerosPublic,
                                 0x41,(BN_CTX *)0x0);
          local_d0[0] = iVar2 != 0;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f8,(internal *)local_d0,
                       (AssertionResult *)
                       "EC_KEY_oct2key(key.get(), kECKeyWithZerosPublic, sizeof(kECKeyWithZerosPublic), nullptr)"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xf4,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
            goto LAB_002ce08b;
          }
          iVar2 = EC_KEY_oct2priv(local_b0._M_head_impl,"",0x20);
          local_d0[0] = iVar2 != 0;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f8,(internal *)local_d0,
                       (AssertionResult *)
                       "EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate, sizeof(kECKeyWithZerosRawPrivate))"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xf6,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
            goto LAB_002ce08b;
          }
          bVar7 = EncodeECPrivateKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     (local_78 + 0x20),local_b0._M_head_impl);
          local_d0[0] = bVar7;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!bVar7) {
            testing::Message::Message((Message *)local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f8,(internal *)local_d0,
                       (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xf7,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            if ((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]) != local_e8) {
              operator_delete((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]),
                              CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
            }
            if (local_108 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_108 + 8))();
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
          }
          local_d0 = (undefined1  [8])&(anonymous_namespace)::kECKeyWithZeros;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x79;
          local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (aStack_50._M_allocated_capacity - local_78._32_8_);
          local_108 = (undefined1  [8])local_78._32_8_;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_f8,"Bytes(kECKeyWithZeros)","Bytes(out.data(), out.size())",
                     (Bytes *)local_d0,(Bytes *)local_108);
          if (local_f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_d0);
            if ((undefined8 *)CONCAT71(uStack_ef,dStack_f0) == (undefined8 *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)CONCAT71(uStack_ef,dStack_f0);
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_108,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xf8,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_108,(Message *)local_d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
            if (local_d0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_d0 + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(uStack_ef,dStack_f0) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(&dStack_f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(uStack_ef,dStack_f0));
          }
          pEVar4 = (EC_KEY *)EC_KEY_new_by_curve_name(0x19f);
          _Var1._M_head_impl = local_b0._M_head_impl;
          bVar7 = local_b0._M_head_impl != (EC_KEY *)0x0;
          local_b0._M_head_impl = pEVar4;
          if (bVar7) {
            EC_KEY_free((EC_KEY *)_Var1._M_head_impl);
          }
          local_d0[0] = local_b0._M_head_impl != (EC_KEY *)0x0;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_b0._M_head_impl == (EC_KEY *)0x0) {
            testing::Message::Message((Message *)local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f8,(internal *)local_d0,(AssertionResult *)0x5e57b2,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xfc,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
            goto LAB_002ce08b;
          }
          iVar2 = EC_KEY_oct2priv(local_b0._M_head_impl,
                                  (uint8_t *)
                                  ((long)&(anonymous_namespace)::kECKeyWithZerosRawPrivate + 1),0x1f
                                 );
          local_d0[0] = iVar2 == 0;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 != 0) {
            testing::Message::Message((Message *)local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f8,(internal *)local_d0,
                       (AssertionResult *)
                       "EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate + 1, sizeof(kECKeyWithZerosRawPrivate) - 1)"
                       ,"true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xfe,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            if ((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]) != local_e8) {
              operator_delete((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]),
                              CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
            }
            if (local_108 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_108 + 8))();
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
          }
          local_f8[0] = (internal)0x0;
          local_e8._1_7_ = 0;
          local_e8[8] = '\0';
          local_e8._9_8_ = 0x100000000000000;
          local_f8._1_7_ = 0;
          dStack_f0 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )0x0;
          uStack_ef = 0;
          local_e8[0] = '\0';
          iVar2 = EC_KEY_oct2priv(local_b0._M_head_impl,local_f8,0x21);
          local_108[0] = iVar2 == 0;
          local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 != 0) {
            pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100;
            testing::Message::Message((Message *)&local_110);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d0,(internal *)local_108,
                       (AssertionResult *)"EC_KEY_oct2priv(key.get(), padded, sizeof(padded))",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x102,(char *)local_d0);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_110);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            if (local_d0 != (undefined1  [8])&local_c0) {
              operator_delete((void *)local_d0,local_c0._M_allocated_capacity + 1);
            }
            __ptr_00 = local_100;
            if (local_110.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_110.data_ + 8))();
              __ptr_00 = local_100;
            }
            goto LAB_002ce0c5;
          }
        }
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_30);
        goto LAB_002cd7d7;
      }
      testing::Message::Message((Message *)local_d0);
      if ((undefined8 *)CONCAT71(uStack_ef,dStack_f0) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(uStack_ef,dStack_f0);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xe6,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_d0);
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_d0 + 8))();
    }
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uStack_ef,dStack_f0);
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pdVar5 = &dStack_f0;
LAB_002cd7d2:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(pdVar5,local_a0);
    }
  }
LAB_002cd7d7:
  if ((AssertHelperData *)local_78._32_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_78._32_8_,aStack_50._8_8_ - local_78._32_8_);
  }
LAB_002cd7f4:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_b0);
  return;
}

Assistant:

TEST(ECTest, ZeroPadding) {
  // Check that the correct encoding round-trips.
  bssl::UniquePtr<EC_KEY> key =
      DecodeECPrivateKey(kECKeyWithZeros, sizeof(kECKeyWithZeros));
  ASSERT_TRUE(key);
  std::vector<uint8_t> out;
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // Check the private key encodes correctly, including with the leading zeros.
  EXPECT_EQ(32u, EC_KEY_priv2oct(key.get(), nullptr, 0));
  uint8_t buf[32];
  ASSERT_EQ(32u, EC_KEY_priv2oct(key.get(), buf, sizeof(buf)));
  EXPECT_EQ(Bytes(buf), Bytes(kECKeyWithZerosRawPrivate));

  // Buffer too small.
  EXPECT_EQ(0u, EC_KEY_priv2oct(key.get(), buf, sizeof(buf) - 1));

  // Extra space in buffer.
  uint8_t large_buf[33];
  ASSERT_EQ(32u, EC_KEY_priv2oct(key.get(), large_buf, sizeof(large_buf)));
  EXPECT_EQ(Bytes(buf), Bytes(kECKeyWithZerosRawPrivate));

  // Allocating API.
  uint8_t *buf_alloc;
  size_t len = EC_KEY_priv2buf(key.get(), &buf_alloc);
  ASSERT_GT(len, 0u);
  bssl::UniquePtr<uint8_t> free_buf_alloc(buf_alloc);
  EXPECT_EQ(Bytes(buf_alloc, len), Bytes(kECKeyWithZerosRawPrivate));

  // Keys without leading zeros also parse, but they encode correctly.
  key = DecodeECPrivateKey(kECKeyMissingZeros, sizeof(kECKeyMissingZeros));
  ASSERT_TRUE(key);
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // Test the key can be constructed with |EC_KEY_oct2*|.
  key.reset(EC_KEY_new_by_curve_name(NID_X9_62_prime256v1));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_oct2key(key.get(), kECKeyWithZerosPublic,
                             sizeof(kECKeyWithZerosPublic), nullptr));
  ASSERT_TRUE(EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate,
                              sizeof(kECKeyWithZerosRawPrivate)));
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // |EC_KEY_oct2priv|'s format is fixed-width and must match the group order.
  key.reset(EC_KEY_new_by_curve_name(NID_X9_62_prime256v1));
  ASSERT_TRUE(key);
  EXPECT_FALSE(EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate + 1,
                               sizeof(kECKeyWithZerosRawPrivate) - 1));
  uint8_t padded[sizeof(kECKeyWithZerosRawPrivate) + 1] = {0};
  memcpy(padded + 1, kECKeyWithZerosRawPrivate,
         sizeof(kECKeyWithZerosRawPrivate));
  EXPECT_FALSE(EC_KEY_oct2priv(key.get(), padded, sizeof(padded)));
}